

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

int __thiscall
cmMakefile::TryCompile
          (cmMakefile *this,string *srcdir,string *bindir,string *projectName,string *targetName,
          bool fast,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmakeArgs,string *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  cmGlobalGenerator *gg;
  char *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string local_380;
  string *local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string *local_338;
  string *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  cmWorkingDirectory workdir;
  cmake cm;
  
  this->IsSourceFileTryCompile = fast;
  local_360 = srcdir;
  local_338 = projectName;
  local_330 = targetName;
  bVar1 = cmsys::SystemTools::FileIsDirectory(bindir);
  if (!bVar1) {
    cmsys::SystemTools::MakeDirectory((bindir->_M_dataplus)._M_p);
  }
  cmWorkingDirectory::cmWorkingDirectory(&workdir,bindir);
  cmake::cmake(&cm,RoleProject);
  iVar3 = 1;
  cmake::SetIsInTryCompile(&cm,true);
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_380);
  gg = cmake::CreateGlobalGenerator(&cm,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  if (gg == (cmGlobalGenerator *)0x0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_328);
    std::operator+(&local_358,"Global generator \'",&local_328);
    std::operator+(&local_380,&local_358,"\' could not be created.");
    IssueMessage(this,INTERNAL_ERROR,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_358);
    this_00 = &local_328;
  }
  else {
    cmake::SetGlobalGenerator(&cm,gg);
    cmake::SetHomeDirectory(&cm,local_360);
    cmake::SetHomeOutputDirectory(&cm,bindir);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorPlatform);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorToolset);
    cmake::LoadCache(&cm);
    iVar2 = (*gg->_vptr_cmGlobalGenerator[0x1f])(gg);
    if ((char)iVar2 == '\0') {
      std::__cxx11::string::string
                ((string *)&local_380,"CMAKE_TRY_COMPILE_CONFIGURATION",(allocator *)&local_358);
      value = GetDefinition(this,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      if (value != (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_380,"CMAKE_BUILD_TYPE",(allocator *)&local_358);
        cmake::AddCacheEntry(&cm,&local_380,value,"Build configuration",3);
        std::__cxx11::string::~string((string *)&local_380);
      }
    }
    if (cmakeArgs !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      cm.WarnUnusedCli = false;
      cmake::SetCacheArgs(&cm,cmakeArgs);
    }
    cmGlobalGenerator::EnableLanguagesFromGenerator(gg,this->GlobalGenerator,this);
    std::__cxx11::string::string
              ((string *)&local_380,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",(allocator *)&local_358);
    bVar1 = IsOn(this,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_380,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",(allocator *)&local_358);
      cmake::AddCacheEntry(&cm,&local_380,"TRUE","",4);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_380,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",(allocator *)&local_358);
      cmake::AddCacheEntry(&cm,&local_380,"FALSE","",4);
    }
    std::__cxx11::string::~string((string *)&local_380);
    iVar2 = cmake::Configure(&cm);
    if (iVar2 == 0) {
      iVar2 = cmake::Generate(&cm);
      if (iVar2 == 0) {
        iVar3 = cmGlobalGenerator::TryCompile
                          (this->GlobalGenerator,local_360,bindir,local_338,local_330,fast,output,
                           this);
        goto LAB_002f36e4;
      }
      std::__cxx11::string::string
                ((string *)&local_380,"Failed to generate test project build system.",
                 (allocator *)&local_358);
      IssueMessage(this,FATAL_ERROR,&local_380);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_380,"Failed to configure test project build system.",
                 (allocator *)&local_358);
      IssueMessage(this,FATAL_ERROR,&local_380);
    }
    this_00 = &local_380;
  }
  std::__cxx11::string::~string((string *)this_00);
  cmSystemTools::s_FatalErrorOccured = true;
LAB_002f36e4:
  this->IsSourceFileTryCompile = false;
  cmake::~cmake(&cm);
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return iVar3;
}

Assistant:

int cmMakefile::TryCompile(const std::string& srcdir,
                           const std::string& bindir,
                           const std::string& projectName,
                           const std::string& targetName, bool fast,
                           const std::vector<std::string>* cmakeArgs,
                           std::string& output)
{
  this->IsSourceFileTryCompile = fast;
  // does the binary directory exist ? If not create it...
  if (!cmSystemTools::FileIsDirectory(bindir)) {
    cmSystemTools::MakeDirectory(bindir.c_str());
  }

  // change to the tests directory and run cmake
  // use the cmake object instead of calling cmake
  cmWorkingDirectory workdir(bindir);

  // make sure the same generator is used
  // use this program as the cmake to be run, it should not
  // be run that way but the cmake object requires a vailid path
  cmake cm(cmake::RoleProject);
  cm.SetIsInTryCompile(true);
  cmGlobalGenerator* gg =
    cm.CreateGlobalGenerator(this->GetGlobalGenerator()->GetName());
  if (!gg) {
    this->IssueMessage(cmake::INTERNAL_ERROR, "Global generator '" +
                         this->GetGlobalGenerator()->GetName() +
                         "' could not be created.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }
  cm.SetGlobalGenerator(gg);

  // do a configure
  cm.SetHomeDirectory(srcdir);
  cm.SetHomeOutputDirectory(bindir);
  cm.SetGeneratorPlatform(this->GetCMakeInstance()->GetGeneratorPlatform());
  cm.SetGeneratorToolset(this->GetCMakeInstance()->GetGeneratorToolset());
  cm.LoadCache();
  if (!gg->IsMultiConfig()) {
    if (const char* config =
          this->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION")) {
      // Tell the single-configuration generator which one to use.
      // Add this before the user-provided CMake arguments in case
      // one of the arguments is -DCMAKE_BUILD_TYPE=...
      cm.AddCacheEntry("CMAKE_BUILD_TYPE", config, "Build configuration",
                       cmStateEnums::STRING);
    }
  }
  // if cmake args were provided then pass them in
  if (cmakeArgs) {
    // FIXME: Workaround to ignore unused CLI variables in try-compile.
    //
    // Ideally we should use SetArgs to honor options like --warn-unused-vars.
    // However, there is a subtle problem when certain arguments are passed to
    // a macro wrapping around try_compile or try_run that does not escape
    // semicolons in its parameters but just passes ${ARGV} or ${ARGN}.  In
    // this case a list argument like "-DVAR=a;b" gets split into multiple
    // cmake arguments "-DVAR=a" and "b".  Currently SetCacheArgs ignores
    // argument "b" and uses just "-DVAR=a", leading to a subtle bug in that
    // the try_compile or try_run does not get the proper value of VAR.  If we
    // call SetArgs here then it would treat "b" as the source directory and
    // cause an error such as "The source directory .../CMakeFiles/CMakeTmp/b
    // does not exist", thus breaking the try_compile or try_run completely.
    //
    // Strictly speaking the bug is in the wrapper macro because the CMake
    // language has always flattened nested lists and the macro should escape
    // the semicolons in its arguments before forwarding them.  However, this
    // bug is so subtle that projects typically work anyway, usually because
    // the value VAR=a is sufficient for the try_compile or try_run to get the
    // correct result.  Calling SetArgs here would break such projects that
    // previously built.  Instead we work around the issue by never reporting
    // unused arguments and ignoring options such as --warn-unused-vars.
    cm.SetWarnUnusedCli(false);
    // cm.SetArgs(*cmakeArgs, true);

    cm.SetCacheArgs(*cmakeArgs);
  }
  // to save time we pass the EnableLanguage info directly
  gg->EnableLanguagesFromGenerator(this->GetGlobalGenerator(), this);
  if (this->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "TRUE", "",
                     cmStateEnums::INTERNAL);
  } else {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "FALSE", "",
                     cmStateEnums::INTERNAL);
  }
  if (cm.Configure() != 0) {
    this->IssueMessage(cmake::FATAL_ERROR,
                       "Failed to configure test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  if (cm.Generate() != 0) {
    this->IssueMessage(cmake::FATAL_ERROR,
                       "Failed to generate test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // finally call the generator to actually build the resulting project
  int ret = this->GetGlobalGenerator()->TryCompile(
    srcdir, bindir, projectName, targetName, fast, output, this);

  this->IsSourceFileTryCompile = false;
  return ret;
}